

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  value_bit_array<_1,_1> *this_00;
  uint size;
  pointer pmVar1;
  pointer pfVar2;
  unsigned_long *puVar3;
  FILE *__stream;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *pfVar6;
  ulong uVar7;
  rc_data *prVar8;
  bound_factor *pbVar9;
  undefined8 extraout_RAX;
  int iVar10;
  pointer *ppfVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  pointer pfVar19;
  string_view name;
  
  name._M_str = "solver_inequalities_101coeff";
  name._M_len = 0x1c;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  size = (this->ap).m_rows_values.m_length;
  uVar7 = (ulong)size * 4;
  pfVar6 = (float *)operator_new__(uVar7);
  memset(pfVar6,0,uVar7);
  (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar6;
  this_00 = &this->A;
  bit_array_impl::bit_array_impl(&this_00->super_bit_array_impl,size);
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)*(pointer *)
                 ((long)&(pmVar1->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar1->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  lVar12 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  if (lVar12 != 0x28) {
    lVar12 = (lVar12 >> 3) * -0x3333333333333333 + -1;
    ppfVar11 = (pointer *)
               ((long)&pmVar1[1].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    do {
      uVar15 = (long)*ppfVar11 - (long)((_Vector_impl_data *)(ppfVar11 + -1))->_M_start >> 3;
      if (uVar7 <= uVar15) {
        uVar7 = uVar15;
      }
      ppfVar11 = ppfVar11 + 5;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar7 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  prVar8 = (rc_data *)operator_new__(uVar7);
  memset(prVar8,0,uVar7);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
  ._M_head_impl = prVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)m_;
  uVar7 = SUB168(auVar5 * ZEXT816(0xc),0);
  if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pbVar9 = (bound_factor *)operator_new__(uVar7);
  memset(pbVar9,0,uVar7);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
  ._M_head_impl = pbVar9;
  uVar7 = 0xffffffffffffffff;
  if (-1 < m_) {
    uVar7 = (long)m_ << 2;
  }
  pfVar6 = (float *)operator_new__(uVar7);
  pvVar18 = (void *)0x0;
  memset(pfVar6,0,uVar7);
  (this->pi)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar6;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  uVar7 = ((long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if ((int)uVar7 != 0) {
    uVar15 = 0;
    do {
      pmVar1 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar19 = *(pointer *)
                 &pmVar1[uVar15].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar1[uVar15].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar19 == pfVar2) {
        uVar14 = 0;
        iVar16 = 0;
      }
      else {
        iVar16 = 0;
        uVar14 = 0;
        do {
          if ((pfVar19->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_inequalities_101coeff();
            goto LAB_00446647;
          }
          iVar17 = (int)pvVar18;
          if (pfVar19->factor < 1) {
            bit_array_impl::unset(&this_00->super_bit_array_impl,iVar17);
          }
          else {
            bit_array_impl::set(&this_00->super_bit_array_impl,iVar17);
          }
          pvVar18 = (void *)(ulong)(iVar17 + 1);
          uVar14 = (ulong)((int)uVar14 + (uint)(0 < pfVar19->factor));
          iVar16 = iVar16 + (uint)(pfVar19->factor < 1);
          pfVar19 = pfVar19 + 1;
        } while (pfVar19 != pfVar2);
      }
      pmVar1 = (csts->
               super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar15;
      iVar17 = pmVar1->min;
      iVar10 = pmVar1->max;
      iVar13 = (int)uVar14;
      if (iVar17 == iVar10) {
        pbVar9 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar9[uVar15].min = iVar17;
      }
      else {
        iVar10 = -iVar16;
        if (iVar17 != iVar10 && SBORROW4(iVar17,iVar10) == iVar17 + iVar16 < 0) {
          iVar10 = iVar17;
        }
        pbVar9 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar9[uVar15].min = iVar10;
        iVar10 = pmVar1->max;
        if (iVar13 <= pmVar1->max) {
          iVar10 = iVar13;
        }
      }
      pbVar9[uVar15].max = iVar10;
      pbVar9 = (this->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
               ._M_head_impl;
      pbVar9[uVar15].negative_factor = iVar16;
      if (pbVar9[uVar15].max < pbVar9[uVar15].min) {
LAB_00446647:
        itm::solver_inequalities_101coeff();
LAB_0044664c:
        itm::solver_inequalities_101coeff();
        operator_delete__(pvVar18);
        *(undefined8 *)(uVar14 + 0x70) = 0;
        prVar8 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar8 != (rc_data *)0x0) {
          operator_delete__(prVar8);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        puVar3 = (this->A).super_bit_array_impl.m_data._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        if (puVar3 != (unsigned_long *)0x0) {
          operator_delete__(puVar3);
        }
        (this->A).super_bit_array_impl.m_data._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
        pfVar6 = (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
        if (pfVar6 != (float *)0x0) {
          operator_delete__(pfVar6);
        }
        (this->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
        super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
        sparse_matrix<int>::~sparse_matrix(&this->ap);
        __stream = (FILE *)(this->super_debug_logger<true>).ofs;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (iVar16 + iVar13 !=
          (int)((ulong)((long)*(pointer *)
                               ((long)&(pmVar1->elements).
                                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                       ._M_impl + 8) -
                       *(long *)&(pmVar1->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl) >> 3)) goto LAB_0044664c;
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar7 & 0xffffffff));
  }
  return;
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }